

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O2

void __thiscall mxx::comm::send<char,13ul>(comm *this,char (*msg) [13],int dest,int tag)

{
  datatype dt;
  
  if ((dest < 0) || (this->m_size <= dest)) {
    assert_fail("0 <= dest && dest < this->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/comm_fwd.hpp"
                ,0x134,"send");
  }
  dt._vptr_datatype = (_func_int **)&PTR__datatype_00148328;
  dt.mpitype = (MPI_Datatype)&ompi_mpi_char;
  dt.builtin = true;
  MPI_Send(msg,0xc,&ompi_mpi_char,dest,tag,this->mpi_comm);
  datatype::~datatype(&dt);
  return;
}

Assistant:

inline void send(const CharT(&msg)[N], int dest, int tag = 0) const {
        MXX_ASSERT(0 <= dest && dest < this->size());
        if (N < mxx::max_int) {
            mxx::datatype dt = mxx::get_datatype<CharT>();
            MPI_Send(const_cast<CharT*>(msg), N-1, dt.type(), dest, tag, this->mpi_comm);
        } else {
            mxx::datatype dt = mxx::get_datatype<CharT>().contiguous(N-1);
            MPI_Send(const_cast<CharT*>(msg), 1, dt.type(), dest, tag, this->mpi_comm);
        }
    }